

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[46],kj::_::DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,kj::_::TableMapping<unsigned_int>>,kj::MappedIterator<kj::InsertionOrderIndex::Iterator,kj::_::TableMapping<unsigned_int>>>&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [46],
               DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>,_kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>_>
               *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  char argValues [2] [7];
  ArrayPtr<kj::String> in_stack_ffffffffffffff68;
  char *apcStack_88 [2];
  size_t sStack_78;
  ArrayDisposer *pAStack_70;
  String local_68;
  StringPtr local_50;
  char *local_40;
  undefined8 local_38;
  
  str<char_const(&)[46]>
            ((String *)&stack0xffffffffffffff68,(kj *)params,
             (char (*) [46])CONCAT44(in_register_00000014,severity));
  local_40 = "(can\'t stringify)";
  local_38 = 0x12;
  local_50.content.ptr = "(can\'t stringify)";
  local_50.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_68,(_ *)&local_40,&params_1->op,&local_50,(StringPtr *)params);
  apcStack_88[1] = local_68.content.ptr;
  sStack_78 = local_68.content.size_;
  pAStack_70 = local_68.content.disposer;
  logInternal((Debug *)file,(char *)(ulong)line._0_4_,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff68,in_stack_ffffffffffffff68);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff70 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff68 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)apcStack_88 + lVar3))
                (*(undefined8 **)((long)apcStack_88 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}